

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.c
# Opt level: O0

cilkred_map ** fast_path_reductions_for_spawn_return(__cilkrts_worker *w,full_frame *ff)

{
  byte bVar1;
  full_frame *in_RSI;
  __cilkrts_worker *in_RDI;
  splice_left_ptrs sVar2;
  int case_value;
  splice_left_ptrs left_ptrs;
  full_frame *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  cilkred_map **local_38;
  cilkred_map **local_8;
  
  if (in_RDI->l->pending_exception == (pending_exception_info *)0x0) {
    sVar2 = compute_left_ptrs_for_spawn_return(in_RDI,in_RSI);
    local_38 = sVar2.map_ptr;
    splice_exceptions_for_spawn
              ((__cilkrts_worker *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8,(pending_exception_info **)0x114ce2);
    bVar1 = (in_RSI->right_reducer_map != (cilkred_map *)0x0) * '\x04' +
            (in_RDI->reducer_map != (cilkred_map *)0x0) * '\x02' + (*local_38 != (cilkred_map *)0x0)
    ;
    if (bVar1 < 2) {
      local_8 = (cilkred_map **)0x0;
    }
    else if (bVar1 == 2) {
      *local_38 = in_RDI->reducer_map;
      in_RDI->reducer_map = (cilkred_map *)0x0;
      local_8 = (cilkred_map **)0x0;
    }
    else if (bVar1 == 4) {
      *local_38 = in_RSI->right_reducer_map;
      in_RSI->right_reducer_map = (cilkred_map *)0x0;
      local_8 = (cilkred_map **)0x0;
    }
    else {
      local_8 = local_38;
    }
    return local_8;
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                ,0xdd3,"NULL == w->l->pending_exception");
}

Assistant:

struct cilkred_map**
fast_path_reductions_for_spawn_return(__cilkrts_worker *w,
                                      full_frame *ff)
{
    // ASSERT: we hold ff->parent->lock.
    splice_left_ptrs left_ptrs;

    CILK_ASSERT(NULL == w->l->pending_exception);

    // Figure out the pointers to the left where I want
    // to put reducers and exceptions.
    left_ptrs = compute_left_ptrs_for_spawn_return(w, ff);
    
    // Go ahead and merge exceptions while holding the lock.
    splice_exceptions_for_spawn(w, ff, left_ptrs.exception_ptr);

    // Now check if we have any reductions to perform.
    //
    // Consider all the cases of left, middle and right maps.
    //  0. (-, -, -)  :  finish and return 1
    //  1. (L, -, -)  :  finish and return 1
    //  2. (-, M, -)  :  slide over to left, finish, and return 1.
    //  3. (L, M, -)  :  return 0
    //  4. (-, -, R)  :  slide over to left, finish, and return 1.
    //  5. (L, -, R)  :  return 0
    //  6. (-, M, R)  :  return 0
    //  7. (L, M, R)  :  return 0
    //
    // In terms of code:
    //  L == *left_ptrs.map_ptr
    //  M == w->reducer_map
    //  R == f->right_reducer_map.
    //
    // The goal of the code below is to execute the fast path with
    // as few branches and writes as possible.
    
    int case_value = (*(left_ptrs.map_ptr) != NULL);
    case_value += ((w->reducer_map != NULL) << 1);
    case_value += ((ff->right_reducer_map != NULL) << 2);

    // Fastest path is case_value == 0 or 1.
    if (case_value >=2) {
        switch (case_value) {
        case 2:
            *(left_ptrs.map_ptr) = w->reducer_map;
            w->reducer_map = NULL;
            return NULL;
            break;
        case 4:
            *(left_ptrs.map_ptr) = ff->right_reducer_map;
            ff->right_reducer_map = NULL;
            return NULL;
        default:
            // If we have to execute the slow path, then
            // return the pointer to the place to deposit the left
            // map.
            return left_ptrs.map_ptr;
        }
    }

    // Do nothing
    return NULL;
}